

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  int iVar1;
  string *psVar2;
  ostream *poVar3;
  size_type sVar4;
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *in_RSI;
  ostream *in_RDI;
  size_t i_1;
  size_t i;
  int total_tests;
  string kIndent;
  string kTestsuites;
  TestCase *in_stack_000001a8;
  ostream *in_stack_000001b0;
  undefined8 in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong local_f8;
  undefined1 local_e9 [40];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [7];
  undefined1 in_stack_ffffffffffffff6f;
  string *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  string *in_stack_ffffffffffffff80;
  string *psVar5;
  string *element_name;
  undefined4 in_stack_ffffffffffffff90;
  int iVar6;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *local_10;
  ostream *local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::allocator<char>::~allocator(&local_31);
  Indent_abi_cxx11_(iVar6);
  std::operator<<(local_8,"{\n");
  iVar6 = 0;
  psVar5 = (string *)0x0;
  while( true ) {
    element_name = psVar5;
    psVar2 = (string *)
             std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size(local_10);
    if (psVar2 <= psVar5) break;
    std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
              (local_10,(size_type)element_name);
    iVar1 = TestCase::total_test_count((TestCase *)0x1843fa);
    iVar6 = iVar1 + iVar6;
    psVar5 = (string *)&element_name->field_0x1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  OutputJsonKey((ostream *)CONCAT44(iVar6,in_stack_ffffffffffffff90),element_name,
                in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                (bool)in_stack_ffffffffffffff6f);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  OutputJsonKey((ostream *)CONCAT44(iVar6,in_stack_ffffffffffffff90),element_name,
                in_stack_ffffffffffffff80,
                (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  std::__cxx11::string::~string((string *)(local_e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  poVar3 = std::operator<<(local_8,local_68);
  poVar3 = std::operator<<(poVar3,"\"");
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,"\": [\n");
  local_f8 = 0;
  while( true ) {
    sVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size(local_10);
    if (sVar4 <= local_f8) break;
    if (local_f8 != 0) {
      std::operator<<(local_8,",\n");
    }
    std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
              (local_10,local_f8);
    PrintJsonTestCase(in_stack_000001b0,in_stack_000001a8);
    local_f8 = local_f8 + 1;
  }
  poVar3 = std::operator<<(local_8,"\n");
  poVar3 = std::operator<<(poVar3,local_68);
  poVar3 = std::operator<<(poVar3,"]\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestCase*>& test_cases) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (size_t i = 0; i < test_cases.size(); ++i) {
    total_tests += test_cases[i]->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_cases.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestCase(stream, *test_cases[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}